

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::ResolveFuncTypesExprVisitorDelegate::ResolveBlockDeclaration
          (ResolveFuncTypesExprVisitorDelegate *this,Location *loc,BlockDeclaration *decl)

{
  bool bVar1;
  BlockDeclaration *decl_local;
  Location *loc_local;
  ResolveFuncTypesExprVisitorDelegate *this_local;
  
  ResolveFuncTypeWithEmptySignature(this->module_,decl);
  bVar1 = IsInlinableFuncSignature(&decl->sig);
  if (!bVar1) {
    ResolveImplicitlyDefinedFunctionType(loc,this->module_,decl);
  }
  return;
}

Assistant:

void ResolveBlockDeclaration(const Location& loc, BlockDeclaration* decl) {
    ResolveFuncTypeWithEmptySignature(*module_, decl);
    if (!IsInlinableFuncSignature(decl->sig)) {
      ResolveImplicitlyDefinedFunctionType(loc, module_, *decl);
    }
  }